

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSParser::parsePlayList(MPLSParser *this,uint8_t *buffer,int len)

{
  int iVar1;
  int iVar2;
  int local_4c;
  int local_48;
  int SubPath_id;
  int PlayItem_id;
  int number_of_PlayItems;
  BitStreamReader reader;
  int len_local;
  uint8_t *buffer_local;
  MPLSParser *this_local;
  
  reader.m_bitLeft = len;
  BitStreamReader::BitStreamReader((BitStreamReader *)&PlayItem_id);
  BitStreamReader::setBuffer((BitStreamReader *)&PlayItem_id,buffer,buffer + (int)reader.m_bitLeft);
  BitStreamReader::skipBits((BitStreamReader *)&PlayItem_id,0x20);
  BitStreamReader::skipBits((BitStreamReader *)&PlayItem_id,0x10);
  iVar1 = BitStreamReader::getBits<int>((BitStreamReader *)&PlayItem_id,0x10);
  iVar2 = BitStreamReader::getBits<int>((BitStreamReader *)&PlayItem_id,0x10);
  this->number_of_SubPaths = iVar2;
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    parsePlayItem(this,(BitStreamReader *)&PlayItem_id,local_48);
  }
  for (local_4c = 0; local_4c < this->number_of_SubPaths; local_4c = local_4c + 1) {
  }
  return;
}

Assistant:

void MPLSParser::parsePlayList(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_PlayItems = reader.getBits<int>(16);
    number_of_SubPaths = reader.getBits<int>(16);
    for (int PlayItem_id = 0; PlayItem_id < number_of_PlayItems; PlayItem_id++)
    {
        parsePlayItem(reader, PlayItem_id);
    }
    for (int SubPath_id = 0; SubPath_id < number_of_SubPaths; SubPath_id++)
    {
        // SubPath(); // not implemented now
    }
}